

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

void Col_MListSetLength(Col_Word mlist,size_t length)

{
  byte *pbVar1;
  uint uVar2;
  size_t index;
  size_t sVar3;
  Col_Word CVar4;
  ulong uVar5;
  Col_Word root;
  byte *local_28;
  
  pbVar1 = *(byte **)(mlist + 0x10);
  local_28 = pbVar1;
  if (length == 0) {
    if (pbVar1 == (byte *)0x0) {
      uVar2 = 0;
    }
    else if (((ulong)pbVar1 & 0xf) == 0) {
      uVar2 = -(uint)((*pbVar1 & 2) == 0) | *pbVar1 & 0xfffffffe;
    }
    else {
      uVar2 = immediateWordTypes[(uint)pbVar1 & 0x1f];
    }
    if (uVar2 == 0x1a) {
      Col_MVectorSetLength((Col_Word)pbVar1,0);
      return;
    }
    *(undefined8 *)(mlist + 0x10) = 0x14;
  }
  else {
    index = Col_ListLength(mlist);
    sVar3 = Col_ListLoopLength(mlist);
    uVar5 = index - sVar3;
    if (uVar5 == 0 && sVar3 != 0) {
      if (length <= index) {
        *(ulong *)(mlist + 0x10) = (ulong)pbVar1 & 0xfffffffffffffff7;
LAB_0010ffc1:
        Col_MListSetLength(mlist,length);
        return;
      }
      CVar4 = Col_Sublist((Col_Word)pbVar1,0,length - 1);
      *(Col_Word *)(mlist + 0x10) = CVar4;
    }
    else if (sVar3 == 0) {
      if (length >= index && length - index != 0) {
        CVar4 = Col_NewList(length - index,(Col_Word *)0x0);
        Col_MListInsert(mlist,index,CVar4);
        return;
      }
      if (length < index) {
        Col_MListRemove(mlist,length,index - 1);
        return;
      }
    }
    else {
      if (length < uVar5 || length - uVar5 == 0) {
        *(undefined8 *)(mlist + 0x10) = *(undefined8 *)(pbVar1 + 0x10);
        goto LAB_0010ffc1;
      }
      if (pbVar1 == (byte *)0x0) {
        uVar2 = 0;
      }
      else if (((ulong)pbVar1 & 0xf) == 0) {
        uVar2 = -(uint)((*pbVar1 & 2) == 0) | *pbVar1 & 0xfffffffe;
      }
      else {
        uVar2 = immediateWordTypes[(uint)pbVar1 & 0x1f];
      }
      if (uVar2 != 0x26) {
        ConvertToMConcatNode((Col_Word *)&local_28);
      }
      pbVar1 = local_28;
      *(undefined8 *)(mlist + 0x10) = *(undefined8 *)(local_28 + 0x18);
      Col_MListSetLength(mlist,length - uVar5);
      *(undefined8 *)(pbVar1 + 0x18) = *(undefined8 *)(mlist + 0x10);
      UpdateMConcatNode((Col_Word)pbVar1);
      *(byte **)(mlist + 0x10) = pbVar1;
    }
  }
  return;
}

Assistant:

void
Col_MListSetLength(
    Col_Word mlist, /*!< Mutable list to resize. */
    size_t length)  /*!< New length. */
{
    size_t listLength, listLoop;
    Col_Word root;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    root = WORD_WRAP_SOURCE(mlist);

    if (length == 0) {
        /*
         * Empty list.
         */


        switch (WORD_TYPE(root)) {
        case WORD_TYPE_MVECTOR:
            /*
             * Shrink mutable vector so as to preserve its capacity should the
             * list length grow in the future.
             */

            Col_MVectorSetLength(root, 0);
            break;

        default:
            WORD_WRAP_SOURCE(mlist) = WORD_LIST_EMPTY;
        }
        return;
    }

    listLength = Col_ListLength(mlist);
    listLoop = Col_ListLoopLength(mlist);
    if (listLoop && listLoop == listLength) {
        /*
         * List is circular.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CIRCLIST);
        if (length <= listLength) {
            /*
             * Shorten loop.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_CORE(root);
            Col_MListSetLength(mlist, length);
        } else {
            /*
             * Sublist of circular list.
             */

            WORD_WRAP_SOURCE(mlist) = Col_Sublist(root, 0, length-1);
        }
        return;
    } else if (listLoop) {
        /*
         * List is cyclic.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CONCATLIST || WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
        ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

        if (length <= listLength-listLoop) {
            /*
             * Keep head.
             */

            ASSERT(listLoop < listLength);
            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_LEFT(root);
            ASSERT(Col_ListLength(mlist) >= length);
            Col_MListSetLength(mlist, length);
        } else {
            /*
             * Shorten tail. Temporarily use tail as root before recursive call.
             */

            if (WORD_TYPE(root) != WORD_TYPE_MCONCATLIST) {
                ConvertToMConcatNode(&root);
            }
            ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            Col_MListSetLength(mlist, length - (listLength-listLoop));
            WORD_CONCATLIST_RIGHT(root) = WORD_WRAP_SOURCE(mlist);
            UpdateMConcatNode(root);
            WORD_WRAP_SOURCE(mlist) = root;
        }
        return;
    }

    /*
     * Acyclic list.
     */

    if (listLength < length) {
        /*
         * Append void list.
         */

        Col_MListInsert(mlist, listLength, Col_NewList(length - listLength,
                NULL));
    } else if (listLength > length) {
        /*
         * Remove tail.
         */

        Col_MListRemove(mlist, length, listLength-1);
    }
}